

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rsi.c
# Opt level: O2

ErrorNumber test_func_rsi(TA_History *history)

{
  TA_RetCode TVar1;
  TA_TestId TVar2;
  ErrorNumber EVar3;
  ulong uVar4;
  TA_FuncUnstId TVar5;
  char *name;
  ulong uVar6;
  TA_Test_conflict12 *pTVar7;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ulong local_60;
  TA_ParamHolder *local_58;
  TA_FuncHandle *funcHandle;
  TA_RangeTestParam_conflict15 testParam;
  TA_FuncInfo *funcInfo;
  
  uVar4 = 0;
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar7 = tableTest;
  do {
    if (uVar4 == 0x29) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < pTVar7->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_rsi.c"
             ,uVar4 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    TA_SetCompatibility(pTVar7->compatibility);
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    TVar2 = pTVar7->theFunction;
    TVar5 = TA_FUNC_UNST_RSI;
    if (TVar2 == TA_ANY_MA_TEST) {
LAB_0011a7cd:
      TVar1 = TA_SetUnstablePeriod(TVar5,pTVar7->unstablePeriod);
      if (TVar1 != TA_SUCCESS) {
        uVar6 = 0x8a;
        goto LAB_0011ac26;
      }
      TVar2 = pTVar7->theFunction;
    }
    else if (TVar2 == TA_AD_TEST) {
      TVar5 = TA_FUNC_UNST_CMO;
      goto LAB_0011a7cd;
    }
    local_60 = uVar4;
    if (TVar2 == TA_AD_TEST) {
      TVar1 = TA_CMO(pTVar7->startIdx,pTVar7->endIdx,gBuffer[0].in,pTVar7->optInTimePeriod,
                     &outBegIdx,&outNbElement,gBuffer[0].out0);
    }
    else {
      TVar1 = 0x143a;
      if (TVar2 == TA_ANY_MA_TEST) {
        TVar1 = TA_RSI(pTVar7->startIdx,pTVar7->endIdx,gBuffer[0].in,pTVar7->optInTimePeriod,
                       &outBegIdx,&outNbElement,gBuffer[0].out0);
      }
    }
    EVar3 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar3 != TA_TEST_PASS) {
LAB_0011aaf1:
      uVar6 = (ulong)EVar3;
      uVar4 = local_60;
LAB_0011ac26:
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_rsi.c"
             ,uVar4 & 0xffffffff,uVar6);
      return (ErrorNumber)uVar6;
    }
    EVar3 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar7->expectedRetCode,outBegIdx,
                               pTVar7->expectedBegIdx,outNbElement,pTVar7->expectedNbElement,
                               pTVar7->oneOfTheExpectedOutReal0,
                               pTVar7->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) {
LAB_0011aade:
      printf("Fail for output id=%d\n",0);
      goto LAB_0011aaf1;
    }
    outNbElement = 0;
    outBegIdx = 0;
    if (pTVar7->theFunction == TA_AD_TEST) {
      TVar1 = TA_CMO(pTVar7->startIdx,pTVar7->endIdx,gBuffer[1].in,pTVar7->optInTimePeriod,
                     &outBegIdx,&outNbElement,gBuffer[1].in);
    }
    else {
      TVar1 = 0x143b;
      if (pTVar7->theFunction == TA_ANY_MA_TEST) {
        TVar1 = TA_RSI(pTVar7->startIdx,pTVar7->endIdx,gBuffer[1].in,pTVar7->optInTimePeriod,
                       &outBegIdx,&outNbElement,gBuffer[1].in);
      }
    }
    EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011aaf1;
    EVar3 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar7->expectedRetCode,outBegIdx,
                               pTVar7->expectedBegIdx,outNbElement,pTVar7->expectedNbElement,
                               pTVar7->oneOfTheExpectedOutReal0,
                               pTVar7->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011aade;
    name = "RSI";
    if (pTVar7->theFunction != TA_ANY_MA_TEST) {
      if (pTVar7->theFunction == TA_AD_TEST) {
        name = "CMO";
        goto LAB_0011a977;
      }
      TVar1 = 0x143c;
LAB_0011ac0b:
      uVar4 = local_60;
      printf("Fail: TA_GetFuncHandle with retCode = %d\n",(ulong)TVar1);
      uVar6 = 600;
      goto LAB_0011ac26;
    }
LAB_0011a977:
    TVar1 = TA_GetFuncHandle(name,&funcHandle);
    if (TVar1 != TA_SUCCESS) goto LAB_0011ac0b;
    TVar1 = TA_GetFuncInfo(funcHandle,&funcInfo);
    uVar4 = local_60;
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_GetFuncInfo with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x259;
      goto LAB_0011ac26;
    }
    TVar1 = TA_ParamHolderAlloc(funcHandle,&local_58);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_ParamHolderAlloc with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x25a;
      goto LAB_0011ac26;
    }
    TVar1 = TA_SetInputParamRealPtr(local_58,0,gBuffer[0].in);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_SetInputParamRealPtr with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x25c;
      goto LAB_0011ac26;
    }
    TVar1 = TA_SetOptInputParamInteger(local_58,0,pTVar7->optInTimePeriod);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_SetOptInputParamInteger with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x25d;
      goto LAB_0011ac26;
    }
    TVar1 = TA_SetOutputParamRealPtr(local_58,0,gBuffer[1].out0);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_SetOutputParamRealPtr with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x25e;
      goto LAB_0011ac26;
    }
    TVar1 = TA_CallFunc(local_58,pTVar7->startIdx,pTVar7->endIdx,&outBegIdx,&outNbElement);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_CallFunc with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x25f;
      goto LAB_0011ac26;
    }
    TVar1 = TA_ParamHolderFree(local_58);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_GetFuncHandle with retCode = %d\n",(ulong)TVar1);
      uVar6 = 0x25b;
      goto LAB_0011ac26;
    }
    EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].out0);
    if (EVar3 != TA_TEST_PASS) {
LAB_0011ab2d:
      uVar6 = (ulong)EVar3;
      goto LAB_0011ac26;
    }
    EVar3 = checkExpectedValue(gBuffer[1].out0,TA_SUCCESS,pTVar7->expectedRetCode,outBegIdx,
                               pTVar7->expectedBegIdx,outNbElement,pTVar7->expectedNbElement,
                               pTVar7->oneOfTheExpectedOutReal0,
                               pTVar7->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) {
      uVar6 = (ulong)EVar3;
      printf("Fail for output id=%d\n",0);
      goto LAB_0011ac26;
    }
    testParam.close = history->close;
    testParam.test = pTVar7;
    if (pTVar7->doRangeTestFlag != 0) {
      TVar5 = TA_FUNC_UNST_RSI;
      if (pTVar7->theFunction != TA_ANY_MA_TEST) {
        if (pTVar7->theFunction != TA_AD_TEST) goto LAB_0011aacd;
        TVar5 = TA_FUNC_UNST_CMO;
      }
      EVar3 = doRangeTest(rangeTestFunction,TVar5,&testParam,1,0);
      if (EVar3 != TA_TEST_PASS) goto LAB_0011ab2d;
    }
LAB_0011aacd:
    uVar4 = uVar4 + 1;
    pTVar7 = pTVar7 + 1;
  } while( true );
}

Assistant:

ErrorNumber test_func_rsi( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}